

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeLockTable(Btree *p,int iTab,u8 isWriteLock)

{
  int local_1c;
  u8 lockType;
  int rc;
  u8 isWriteLock_local;
  int iTab_local;
  Btree *p_local;
  
  local_1c = 0;
  if (p->sharable != '\0') {
    sqlite3BtreeEnter(p);
    local_1c = querySharedCacheTableLock(p,iTab,isWriteLock + '\x01');
    if (local_1c == 0) {
      local_1c = setSharedCacheTableLock(p,iTab,isWriteLock + '\x01');
    }
    sqlite3BtreeLeave(p);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLockTable(Btree *p, int iTab, u8 isWriteLock){
  int rc = SQLITE_OK;
  assert( p->inTrans!=TRANS_NONE );
  if( p->sharable ){
    u8 lockType = READ_LOCK + isWriteLock;
    assert( READ_LOCK+1==WRITE_LOCK );
    assert( isWriteLock==0 || isWriteLock==1 );

    sqlite3BtreeEnter(p);
    rc = querySharedCacheTableLock(p, iTab, lockType);
    if( rc==SQLITE_OK ){
      rc = setSharedCacheTableLock(p, iTab, lockType);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}